

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O1

void P_RunEffect(AActor *actor,int effects)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  uint uVar10;
  uint uVar11;
  particle_t *ppVar12;
  int *piVar13;
  ulong uVar14;
  int iVar15;
  bool bVar16;
  DVector2 v;
  DVector3 local_68;
  DAngle local_50;
  DAngle local_48;
  DAngle local_40;
  DAngle local_38;
  
  dVar5 = c_atan2((actor->Vel).Y,(actor->Vel).X);
  dVar5 = dVar5 * 57.29577951308232;
  if (((effects & 1U) != 0) && (((byte)cl_rockettrails.Value & 1) != 0)) {
    dVar1 = actor->radius;
    dVar6 = FFastTrig::cos(&fasttrig,dVar5 * 11930464.711111112 + 6755399441055744.0);
    dVar6 = dVar6 * dVar1 * -2.0;
    dVar1 = actor->radius * -2.0;
    dVar7 = FFastTrig::sin(&fasttrig,dVar1);
    dVar7 = dVar7 * dVar1;
    dVar1 = ((actor->Vel).Z * -0.125 + 0.6666666666666666) * actor->Height;
    uVar10 = FRandom::GenRand32(&M_Random);
    ppVar12 = JitterParticle((uVar10 & 0x1f) + 3,1.0);
    if (ppVar12 != (particle_t *)0x0) {
      uVar10 = FRandom::GenRand32(&M_Random);
      dVar8 = (double)(uVar10 & 0xff) * 0.00390625;
      dVar2 = (actor->Vel).Z;
      P_GetOffsetPosition((actor->__Pos).X,(actor->__Pos).Y,dVar6 - (actor->Vel).X * dVar8,
                          dVar7 - (actor->Vel).Y * dVar8);
      (ppVar12->Pos).Z = (dVar1 - dVar8 * dVar2) + (actor->__Pos).Z;
      (ppVar12->Pos).X = local_68.X;
      (ppVar12->Pos).Y = local_68.Y;
      uVar10 = FRandom::GenRand32(&M_Random);
      dVar2 = (double)(int)((uVar10 & 0xff) - 0x80) * 0.005;
      dVar8 = FFastTrig::cos(&fasttrig,(dVar5 + 90.0) * 11930464.711111112 + 6755399441055744.0);
      dVar8 = dVar8 * dVar2 + (ppVar12->Vel).X;
      (ppVar12->Vel).X = dVar8;
      dVar8 = FFastTrig::sin(&fasttrig,dVar8);
      (ppVar12->Vel).Y = dVar8 * dVar2 + (ppVar12->Vel).Y;
      (ppVar12->Vel).Z = (ppVar12->Vel).Z + -0.027777777777777776;
      (ppVar12->Acc).Z = (ppVar12->Acc).Z + -0.05;
      ppVar12->color = yellow;
      ppVar12->size = 2.0;
    }
    iVar15 = -6;
    do {
      uVar10 = FRandom::GenRand32(&M_Random);
      ppVar12 = JitterParticle((uVar10 & 0x1f) + 3,1.0);
      if (ppVar12 == (particle_t *)0x0) break;
      uVar10 = FRandom::GenRand32(&M_Random);
      dVar9 = (double)(uVar10 & 0xff) * 0.00390625;
      dVar2 = (actor->Vel).X;
      dVar8 = (actor->Vel).Y;
      dVar3 = (actor->Vel).Z;
      uVar10 = FRandom::GenRand32(&M_Random);
      P_GetOffsetPosition((actor->__Pos).X,(actor->__Pos).Y,dVar6 - dVar2 * dVar9,
                          dVar7 - dVar8 * dVar9);
      (ppVar12->Pos).Z =
           (double)(uVar10 & 0xff) * 0.015625 + (dVar1 - dVar9 * dVar3) + (actor->__Pos).Z;
      (ppVar12->Pos).X = local_68.X;
      (ppVar12->Pos).Y = local_68.Y;
      uVar10 = FRandom::GenRand32(&M_Random);
      dVar2 = (double)(int)((uVar10 & 0xff) - 0x80) * 0.005;
      dVar8 = FFastTrig::cos(&fasttrig,dVar2);
      dVar8 = dVar8 * dVar2 + (ppVar12->Vel).X;
      (ppVar12->Vel).X = dVar8;
      dVar8 = FFastTrig::sin(&fasttrig,dVar8);
      (ppVar12->Vel).Y = dVar8 * dVar2 + (ppVar12->Vel).Y;
      (ppVar12->Vel).Z = (ppVar12->Vel).Z + 0.0125;
      (ppVar12->Acc).Z = (ppVar12->Acc).Z + 0.025;
      uVar10 = FRandom::GenRand32(&M_Random);
      piVar13 = &grey2;
      if ((uVar10 & 7) == 0) {
        piVar13 = &grey1;
      }
      ppVar12->color = *piVar13;
      ppVar12->size = 3.0;
      iVar15 = iVar15 + 1;
    } while (iVar15 != 0);
  }
  if (((effects & 2U) != 0) && (((byte)cl_rockettrails.Value & 1) != 0)) {
    local_40.Degrees = dVar5;
    AActor::Vec3Angle(&local_68,actor,actor->radius * -2.0,&local_40,
                      actor->Height * 0.6666666666666666 + (actor->Vel).Z * actor->Height * -0.125,
                      false);
    local_48.Degrees = dVar5 + 180.0;
    P_DrawSplash2(6,&local_68,&local_48,2,2);
  }
  if (((effects & 0x70000U) != 0) && (((byte)level.time & 1) != 0)) {
    uVar14 = (ulong)((effects & 0x70000U) >> 0xc);
    iVar15 = **(int **)((long)P_RunEffect::fountainColors + uVar14);
    iVar4 = **(int **)((long)P_RunEffect::fountainColors + uVar14 + 8);
    ppVar12 = JitterParticle(0x33,1.0);
    if (ppVar12 != (particle_t *)0x0) {
      uVar10 = FRandom::GenRand32(&M_Random);
      dVar5 = actor->radius;
      uVar11 = FRandom::GenRand32(&M_Random);
      dVar5 = (double)(uVar11 & 0xff) * dVar5 * 0.00390625;
      local_38.Degrees = (double)(uVar10 & 0xff) * 1.40625;
      AActor::Vec3Angle(&local_68,actor,dVar5,&local_38,actor->Height + 1.0,false);
      (ppVar12->Pos).Z = local_68.Z;
      (ppVar12->Pos).Y = local_68.Y;
      (ppVar12->Pos).X = local_68.X;
      (ppVar12->Vel).Z =
           (ppVar12->Vel).Z +
           *(double *)(&DAT_0073d740 + (ulong)(dVar5 < actor->radius * 0.125) * 8);
      (ppVar12->Acc).Z = (ppVar12->Acc).Z + -0.09090909090909091;
      uVar10 = FRandom::GenRand32(&M_Random);
      bVar16 = (uVar10 & 0xfe) < 0x1e;
      if (bVar16) {
        iVar15 = iVar4;
      }
      ppVar12->size = *(double *)(&DAT_0073d750 + (ulong)bVar16 * 8);
      ppVar12->color = iVar15;
    }
  }
  if ((effects & 0x20U) != 0) {
    uVar10 = 4;
    do {
      ppVar12 = JitterParticle(0x10,1.0);
      if (ppVar12 != (particle_t *)0x0) {
        uVar11 = FRandom::GenRand32(&M_Random);
        local_50.Degrees = (double)(uVar11 & 0xff) * 1.40625;
        AActor::Vec3Angle(&local_68,actor,actor->radius,&local_50,0.0,false);
        (ppVar12->Pos).Z = local_68.Z;
        (ppVar12->Pos).Y = local_68.Y;
        (ppVar12->Pos).X = local_68.X;
        uVar11 = FRandom::GenRand32(&M_Random);
        ppVar12->color = *P_RunEffect::protectColors[uVar11 & 1];
        (ppVar12->Vel).Z = 1.0;
        uVar11 = FRandom::GenRand32(&M_Random);
        (ppVar12->Acc).Z = (double)(uVar11 & 0xff) * 0.001953125;
        ppVar12->size = 1.0;
        uVar11 = FRandom::GenRand32(&M_Random);
        if (-1 < (char)uVar11) {
          (ppVar12->Pos).Z = actor->Height + (ppVar12->Pos).Z;
          (ppVar12->Vel).Z = -(ppVar12->Vel).Z;
          (ppVar12->Acc).Z = -(ppVar12->Acc).Z;
        }
      }
      uVar10 = uVar10 - 1;
    } while (1 < uVar10);
  }
  return;
}

Assistant:

void P_RunEffect (AActor *actor, int effects)
{
	DAngle moveangle = actor->Vel.Angle();

	particle_t *particle;
	int i;

	if ((effects & FX_ROCKET) && (cl_rockettrails & 1))
	{
		// Rocket trail
		double backx = -actor->radius * 2 * moveangle.Cos();
		double backy = -actor->radius * 2 * moveangle.Sin();
		double backz = actor->Height * ((2. / 3) - actor->Vel.Z / 8);

		DAngle an = moveangle + 90.;
		double speed;

		particle = JitterParticle (3 + (M_Random() & 31));
		if (particle) {
			double pathdist = M_Random() / 256.;
			DVector3 pos = actor->Vec3Offset(
				backx - actor->Vel.X * pathdist,
				backy - actor->Vel.Y * pathdist,
				backz - actor->Vel.Z * pathdist);
			particle->Pos = pos;
			speed = (M_Random () - 128) * (1./200);
			particle->Vel.X += speed * an.Cos();
			particle->Vel.Y += speed * an.Sin();
			particle->Vel.Z -= 1./36;
			particle->Acc.Z -= 1./20;
			particle->color = yellow;
			particle->size = 2;
		}
		for (i = 6; i; i--) {
			particle_t *particle = JitterParticle (3 + (M_Random() & 31));
			if (particle) {
				double pathdist = M_Random() / 256.;
				DVector3 pos = actor->Vec3Offset(
					backx - actor->Vel.X * pathdist,
					backy - actor->Vel.Y * pathdist,
					backz - actor->Vel.Z * pathdist + (M_Random() / 64.));
				particle->Pos = pos;

				speed = (M_Random () - 128) * (1./200);
				particle->Vel.X += speed * an.Cos();
				particle->Vel.Y += speed * an.Sin();
				particle->Vel.Z += 1. / 80;
				particle->Acc.Z += 1. / 40;
				if (M_Random () & 7)
					particle->color = grey2;
				else
					particle->color = grey1;
				particle->size = 3;
			} else
				break;
		}
	}
	if ((effects & FX_GRENADE) && (cl_rockettrails & 1))
	{
		// Grenade trail

		DVector3 pos = actor->Vec3Angle(-actor->radius * 2, moveangle, -actor->Height * actor->Vel.Z / 8 + actor->Height * (2. / 3));

		P_DrawSplash2 (6, pos, moveangle + 180, 2, 2);
	}
	if (effects & FX_FOUNTAINMASK)
	{
		// Particle fountain

		static const int *fountainColors[16] = 
			{ &black,	&black,
			  &red,		&red1,
			  &green,	&green1,
			  &blue,	&blue1,
			  &yellow,	&yellow1,
			  &purple,	&purple1,
			  &black,	&grey3,
			  &grey4,	&white
			};
		int color = (effects & FX_FOUNTAINMASK) >> 15;
		MakeFountain (actor, *fountainColors[color], *fountainColors[color+1]);
	}
	if (effects & FX_RESPAWNINVUL)
	{
		// Respawn protection

		static const int *protectColors[2] = { &yellow1, &white };

		for (i = 3; i > 0; i--)
		{
			particle = JitterParticle (16);
			if (particle != NULL)
			{
				DAngle ang = M_Random() * (360 / 256.);
				DVector3 pos = actor->Vec3Angle(actor->radius, ang, 0);
				particle->Pos = pos;
				particle->color = *protectColors[M_Random() & 1];
				particle->Vel.Z = 1;
				particle->Acc.Z = M_Random () / 512.;
				particle->size = 1;
				if (M_Random () < 128)
				{ // make particle fall from top of actor
					particle->Pos.Z += actor->Height;
					particle->Vel.Z = -particle->Vel.Z;
					particle->Acc.Z = -particle->Acc.Z;
				}
			}
		}
	}
}